

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void tinygltf::SerializeGltfBuffer(Buffer *buffer,json *o)

{
  tinygltf *this;
  uint in_ECX;
  string header;
  string encodedData;
  allocator local_91;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_90,"byteLength",(allocator *)&local_70);
  SerializeNumberProperty<unsigned_long>
            (&local_90,
             (long)(buffer->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(buffer->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,o);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string
            ((string *)&local_90,"data:application/octet-stream;base64,",(allocator *)&local_70);
  this = (tinygltf *)
         (buffer->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  base64_encode_abi_cxx11_
            (&local_70,this,
             (uchar *)(ulong)(uint)(*(int *)&(buffer->data).
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish - (int)this)
             ,in_ECX);
  std::__cxx11::string::string((string *)&local_30,"uri",&local_91);
  std::operator+(&local_50,&local_90,&local_70);
  SerializeStringProperty(&local_30,&local_50,o);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  if ((buffer->name)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_90,"name",(allocator *)&local_70);
    SerializeStringProperty(&local_90,&buffer->name,o);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if ((char)(buffer->extras).type_ != '\0') {
    std::__cxx11::string::string((string *)&local_90,"extras",(allocator *)&local_70);
    SerializeValue(&local_90,&buffer->extras,o);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

static void SerializeGltfBuffer(Buffer &buffer, json &o) {
  SerializeNumberProperty("byteLength", buffer.data.size(), o);
  SerializeGltfBufferData(buffer.data, o);

  if (buffer.name.size()) SerializeStringProperty("name", buffer.name, o);

  if (buffer.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", buffer.extras, o);
  }
}